

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlif.c
# Opt level: O0

Abc_Ntk_t * Io_ReadBlifNetworkOne(Io_ReadBlif_t *p)

{
  char *pcVar1;
  bool bVar2;
  FILE *pFile;
  int iVar3;
  uint uVar4;
  Abc_Ntk_t *pNtk_00;
  char *pcVar5;
  Vec_Ptr_t *pVVar6;
  bool bVar7;
  char *local_50;
  char *pPivot;
  char *pToken;
  int fStatus;
  int fTokensReady;
  int iLine;
  char *pDirective;
  Abc_Ntk_t *pNtk;
  ProgressBar *pProgress;
  Io_ReadBlif_t *p_local;
  
  pNtk = (Abc_Ntk_t *)0x0;
  if (p->vTokens == (Vec_Ptr_t *)0x0) {
    __assert_fail("p->vTokens != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlif.c"
                  ,0xf2,"Abc_Ntk_t *Io_ReadBlifNetworkOne(Io_ReadBlif_t *)");
  }
  pNtk_00 = Abc_NtkAlloc(ABC_NTK_NETLIST,ABC_FUNC_SOP,1);
  p->pNtkCur = pNtk_00;
  iVar3 = strcmp((char *)*p->vTokens->pArray,".model");
  if (iVar3 == 0) {
    iVar3 = Vec_PtrSize(p->vTokens);
    if (iVar3 == 2) {
      local_50 = (char *)Vec_PtrEntry(p->vTokens,1);
      for (pPivot = local_50; *pPivot != '\0'; pPivot = pPivot + 1) {
        if ((*pPivot == '/') || (*pPivot == '\\')) {
          local_50 = pPivot + 1;
        }
      }
      pcVar5 = Extra_UtilStrsav(local_50);
      pNtk_00->pName = pcVar5;
LAB_003a86eb:
      pFile = _stdout;
      if (p->pNtkMaster == (Abc_Ntk_t *)0x0) {
        iVar3 = Extra_FileReaderGetFileSize(p->pReader);
        pNtk = (Abc_Ntk_t *)Extra_ProgressBarStart(pFile,iVar3);
      }
      pToken._4_4_ = 0;
      bVar2 = false;
      fStatus = 0;
      while( true ) {
        bVar7 = true;
        if (!bVar2) {
          pVVar6 = Io_ReadBlifGetTokens(p);
          p->vTokens = pVVar6;
          bVar7 = pVVar6 != (Vec_Ptr_t *)0x0;
        }
        if (!bVar7) break;
        if ((p->pNtkMaster == (Abc_Ntk_t *)0x0) && (fStatus % 1000 == 0)) {
          iVar3 = Extra_FileReaderGetCurPosition(p->pReader);
          Extra_ProgressBarUpdate((ProgressBar *)pNtk,iVar3,(char *)0x0);
        }
        bVar2 = false;
        pcVar5 = (char *)*p->vTokens->pArray;
        iVar3 = strcmp(pcVar5,".names");
        if (iVar3 == 0) {
          pToken._4_4_ = Io_ReadBlifNetworkNames(p,&p->vTokens);
          bVar2 = true;
        }
        else {
          iVar3 = strcmp(pcVar5,".gate");
          if (iVar3 == 0) {
            pToken._4_4_ = Io_ReadBlifNetworkGate(p,p->vTokens);
          }
          else {
            iVar3 = strcmp(pcVar5,".latch");
            if (iVar3 == 0) {
              pToken._4_4_ = Io_ReadBlifNetworkLatch(p,p->vTokens);
            }
            else {
              iVar3 = strcmp(pcVar5,".inputs");
              if (iVar3 == 0) {
                pToken._4_4_ = Io_ReadBlifNetworkInputs(p,p->vTokens);
              }
              else {
                iVar3 = strcmp(pcVar5,".outputs");
                if (iVar3 == 0) {
                  pToken._4_4_ = Io_ReadBlifNetworkOutputs(p,p->vTokens);
                }
                else {
                  iVar3 = strcmp(pcVar5,".input_arrival");
                  if (iVar3 == 0) {
                    pToken._4_4_ = Io_ReadBlifNetworkInputArrival(p,p->vTokens);
                  }
                  else {
                    iVar3 = strcmp(pcVar5,".output_required");
                    if (iVar3 == 0) {
                      pToken._4_4_ = Io_ReadBlifNetworkOutputRequired(p,p->vTokens);
                    }
                    else {
                      iVar3 = strcmp(pcVar5,".default_input_arrival");
                      if (iVar3 == 0) {
                        pToken._4_4_ = Io_ReadBlifNetworkDefaultInputArrival(p,p->vTokens);
                      }
                      else {
                        iVar3 = strcmp(pcVar5,".default_output_required");
                        if (iVar3 == 0) {
                          pToken._4_4_ = Io_ReadBlifNetworkDefaultOutputRequired(p,p->vTokens);
                        }
                        else {
                          iVar3 = strcmp(pcVar5,".input_drive");
                          if (iVar3 == 0) {
                            pToken._4_4_ = Io_ReadBlifNetworkInputDrive(p,p->vTokens);
                          }
                          else {
                            iVar3 = strcmp(pcVar5,".output_load");
                            if (iVar3 == 0) {
                              pToken._4_4_ = Io_ReadBlifNetworkOutputLoad(p,p->vTokens);
                            }
                            else {
                              iVar3 = strcmp(pcVar5,".default_input_drive");
                              if (iVar3 == 0) {
                                pToken._4_4_ = Io_ReadBlifNetworkDefaultInputDrive(p,p->vTokens);
                              }
                              else {
                                iVar3 = strcmp(pcVar5,".default_output_load");
                                if (iVar3 == 0) {
                                  pToken._4_4_ = Io_ReadBlifNetworkDefaultOutputLoad(p,p->vTokens);
                                }
                                else {
                                  iVar3 = strcmp(pcVar5,".and_gate_delay");
                                  if (iVar3 == 0) {
                                    pToken._4_4_ = Io_ReadBlifNetworkAndGateDelay(p,p->vTokens);
                                  }
                                  else {
                                    iVar3 = strcmp(pcVar5,".exdc");
                                    if (iVar3 == 0) break;
                                    iVar3 = strcmp(pcVar5,".end");
                                    if (iVar3 == 0) {
                                      pVVar6 = Io_ReadBlifGetTokens(p);
                                      p->vTokens = pVVar6;
                                      break;
                                    }
                                    iVar3 = strcmp(pcVar5,".blackbox");
                                    if (iVar3 == 0) {
                                      pNtk_00->ntkType = ABC_NTK_NETLIST;
                                      pNtk_00->ntkFunc = ABC_FUNC_BLACKBOX;
                                      Mem_FlexStop((Mem_Flex_t *)pNtk_00->pManFunc,0);
                                      pNtk_00->pManFunc = (void *)0x0;
                                    }
                                    else {
                                      pcVar1 = p->pFileName;
                                      uVar4 = Extra_FileReaderGetLineNumber(p->pReader,0);
                                      printf("%s (line %d): Skipping directive \"%s\".\n",pcVar1,
                                             (ulong)uVar4,pcVar5);
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        if (p->vTokens == (Vec_Ptr_t *)0x0) break;
        if (pToken._4_4_ == 1) {
          Extra_ProgressBarStop((ProgressBar *)pNtk);
          Abc_NtkDelete(pNtk_00);
          return (Abc_Ntk_t *)0x0;
        }
        fStatus = fStatus + 1;
      }
      if (p->pNtkMaster != (Abc_Ntk_t *)0x0) {
        return pNtk_00;
      }
      Extra_ProgressBarStop((ProgressBar *)pNtk);
      return pNtk_00;
    }
    iVar3 = Extra_FileReaderGetLineNumber(p->pReader,0);
    p->LineCur = iVar3;
    sprintf(p->sError,"The .model line does not have exactly two entries.");
    Io_ReadBlifPrintErrorMessage(p);
  }
  else {
    iVar3 = strcmp((char *)*p->vTokens->pArray,".exdc");
    if (iVar3 == 0) goto LAB_003a86eb;
    pcVar5 = p->pFileName;
    uVar4 = Extra_FileReaderGetLineNumber(p->pReader,0);
    printf("%s: File parsing skipped after line %d (\"%s\").\n",pcVar5,(ulong)uVar4,
           *p->vTokens->pArray);
    Abc_NtkDelete(pNtk_00);
    p->pNtkCur = (Abc_Ntk_t *)0x0;
  }
  return (Abc_Ntk_t *)0x0;
}

Assistant:

Abc_Ntk_t * Io_ReadBlifNetworkOne( Io_ReadBlif_t * p )
{
    ProgressBar * pProgress = NULL;
    Abc_Ntk_t * pNtk;
    char * pDirective;
    int iLine, fTokensReady, fStatus;

    // make sure the tokens are present
    assert( p->vTokens != NULL );

    // create the new network
    p->pNtkCur = pNtk = Abc_NtkAlloc( ABC_NTK_NETLIST, ABC_FUNC_SOP, 1 );
    // read the model name
    if ( strcmp( (char *)p->vTokens->pArray[0], ".model" ) == 0 )
    {
        char * pToken, * pPivot;
        if ( Vec_PtrSize(p->vTokens) != 2 )
        {
            p->LineCur = Extra_FileReaderGetLineNumber(p->pReader, 0);
            sprintf( p->sError, "The .model line does not have exactly two entries." );
            Io_ReadBlifPrintErrorMessage( p );
            return NULL;
        }
        for ( pPivot = pToken = (char *)Vec_PtrEntry(p->vTokens, 1); *pToken; pToken++ )
            if ( *pToken == '/' || *pToken == '\\' )
                pPivot = pToken+1;
        pNtk->pName = Extra_UtilStrsav( pPivot );
    }
    else if ( strcmp( (char *)p->vTokens->pArray[0], ".exdc" ) != 0 ) 
    {
        printf( "%s: File parsing skipped after line %d (\"%s\").\n", p->pFileName, 
            Extra_FileReaderGetLineNumber(p->pReader, 0), (char*)p->vTokens->pArray[0] );
        Abc_NtkDelete(pNtk);
        p->pNtkCur = NULL;
        return NULL;
    }

    // read the inputs/outputs
    if ( p->pNtkMaster == NULL )
        pProgress = Extra_ProgressBarStart( stdout, Extra_FileReaderGetFileSize(p->pReader) );
    fTokensReady = fStatus = 0;
    for ( iLine = 0; fTokensReady || (p->vTokens = Io_ReadBlifGetTokens(p)); iLine++ )
    {
        if ( p->pNtkMaster == NULL && iLine % 1000 == 0 )
            Extra_ProgressBarUpdate( pProgress, Extra_FileReaderGetCurPosition(p->pReader), NULL );

        // consider different line types
        fTokensReady = 0;
        pDirective = (char *)p->vTokens->pArray[0];
        if ( !strcmp( pDirective, ".names" ) )
            { fStatus = Io_ReadBlifNetworkNames( p, &p->vTokens ); fTokensReady = 1; }
        else if ( !strcmp( pDirective, ".gate" ) )
            fStatus = Io_ReadBlifNetworkGate( p, p->vTokens );
        else if ( !strcmp( pDirective, ".latch" ) )
            fStatus = Io_ReadBlifNetworkLatch( p, p->vTokens );
        else if ( !strcmp( pDirective, ".inputs" ) )
            fStatus = Io_ReadBlifNetworkInputs( p, p->vTokens );
        else if ( !strcmp( pDirective, ".outputs" ) )
            fStatus = Io_ReadBlifNetworkOutputs( p, p->vTokens );
        else if ( !strcmp( pDirective, ".input_arrival" ) )
            fStatus = Io_ReadBlifNetworkInputArrival( p, p->vTokens );
        else if ( !strcmp( pDirective, ".output_required" ) )
            fStatus = Io_ReadBlifNetworkOutputRequired( p, p->vTokens );
        else if ( !strcmp( pDirective, ".default_input_arrival" ) )
            fStatus = Io_ReadBlifNetworkDefaultInputArrival( p, p->vTokens );
        else if ( !strcmp( pDirective, ".default_output_required" ) )
            fStatus = Io_ReadBlifNetworkDefaultOutputRequired( p, p->vTokens );
        else if ( !strcmp( pDirective, ".input_drive" ) )
            fStatus = Io_ReadBlifNetworkInputDrive( p, p->vTokens );
        else if ( !strcmp( pDirective, ".output_load" ) )
            fStatus = Io_ReadBlifNetworkOutputLoad( p, p->vTokens );
        else if ( !strcmp( pDirective, ".default_input_drive" ) )
            fStatus = Io_ReadBlifNetworkDefaultInputDrive( p, p->vTokens );
        else if ( !strcmp( pDirective, ".default_output_load" ) )
            fStatus = Io_ReadBlifNetworkDefaultOutputLoad( p, p->vTokens );
        else if ( !strcmp( pDirective, ".and_gate_delay" ) )
            fStatus = Io_ReadBlifNetworkAndGateDelay( p, p->vTokens );
//        else if ( !strcmp( pDirective, ".subckt" ) )
//            fStatus = Io_ReadBlifNetworkSubcircuit( p, p->vTokens );
        else if ( !strcmp( pDirective, ".exdc" ) )
            break;
        else if ( !strcmp( pDirective, ".end" ) )
        {
            p->vTokens = Io_ReadBlifGetTokens(p);
            break;
        }
        else if ( !strcmp( pDirective, ".blackbox" ) )
        {
            pNtk->ntkType = ABC_NTK_NETLIST;
            pNtk->ntkFunc = ABC_FUNC_BLACKBOX;
            Mem_FlexStop( (Mem_Flex_t *)pNtk->pManFunc, 0 );
            pNtk->pManFunc = NULL;
        }
        else
            printf( "%s (line %d): Skipping directive \"%s\".\n", p->pFileName, 
                Extra_FileReaderGetLineNumber(p->pReader, 0), pDirective );
        if ( p->vTokens == NULL ) // some files do not have ".end" in the end
            break;
        if ( fStatus == 1 )
        {
            Extra_ProgressBarStop( pProgress );
            Abc_NtkDelete( pNtk );
            return NULL;
        }
    }
    if ( p->pNtkMaster == NULL )
        Extra_ProgressBarStop( pProgress );
    return pNtk;
}